

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O0

int __thiscall ON_wString::ReverseFind(ON_wString *this,wchar_t c)

{
  int iVar1;
  int local_20;
  int i;
  wchar_t c_local;
  ON_wString *this_local;
  
  iVar1 = ON_IsValidSingleElementWideCharValue(c);
  if (iVar1 == 0) {
LAB_00996b0d:
    this_local._4_4_ = -1;
  }
  else {
    local_20 = Length(this);
    do {
      if (local_20 < 1) goto LAB_00996b0d;
      local_20 = local_20 + -1;
      this_local._4_4_ = local_20;
    } while (c != this->m_s[local_20]);
  }
  return this_local._4_4_;
}

Assistant:

int ON_wString::ReverseFind( wchar_t c ) const
{
  if (ON_IsValidSingleElementWideCharValue(c))
  {
    // find first single character
    int i = Length();
    while( i > 0 )
    {
      if (c == m_s[--i])
        return i;
    }
  }
  return -1;
}